

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  _Bool _Var5;
  
  uVar1 = state->size;
  uVar2 = state->position;
  uVar4 = 0xffffffff;
  if (uVar2 < uVar1) {
    uVar4 = (uint)state->text[uVar2];
  }
  if ((uVar4 == 0x5f) || ((uVar4 & 0xffffffdf) - 0x41 < 0x1a)) {
    do {
      uVar3 = uVar2;
      uVar4 = 0xffffffff;
      if (uVar3 < uVar1) {
        uVar4 = (uint)state->text[uVar3];
      }
      uVar2 = uVar3 + 1;
    } while (((uVar4 - 0x30 < 10) || (uVar4 == 0x5f)) || ((uVar4 & 0xffffffdf) - 0x41 < 0x1a));
    if (uVar3 < uVar1) {
      _Var5 = state->text[uVar3] == ':';
    }
    else {
      _Var5 = false;
    }
    if (_Var5 != false) {
      state->position = uVar2;
      return _Var5;
    }
  }
  else {
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

static bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)
{
    if(!sysbvm_scanner_isIdentifierStart(sysbvm_scanner_lookAt(state, 0)))
        return false;

    sysbvm_scannerState_t endState = *state;
    while(sysbvm_scanner_isIdentifierMiddle(sysbvm_scanner_lookAt(&endState, 0)))
        ++endState.position;

    if(sysbvm_scanner_lookAt(&endState, 0) == ':')
    {
        ++endState.position;
        *state = endState;
        return true;
    }

    return false;
}